

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O3

Gia_Man_t * Gia_ManAigSynch2(Gia_Man_t *pInit,void *pPars0,int nLutSize,int nRelaxRatio)

{
  int iVar1;
  char *pcVar2;
  Gia_Man_t *pGVar3;
  Gia_Man_t *pGVar4;
  Gia_Man_t *pGVar5;
  Gia_Man_t *p;
  Gia_Man_t *pGia1;
  Gia_Man_t *pGia3;
  size_t sVar6;
  char *pcVar7;
  Jf_Par_t Pars;
  Jf_Par_t local_138;
  
  iVar1 = *(int *)((long)pPars0 + 0x2c);
  Lf_ManSetDefaultPars(&local_138);
  local_138.fCoarsen = 1;
  local_138.fCutMin = 1;
  local_138.nAreaTuner = 5;
  local_138.nCutNum = 0xc;
  local_138.nRelaxRatio = nRelaxRatio;
  local_138.fVerbose = iVar1;
  if (iVar1 != 0) {
    Gia_ManPrintStats(pInit,(Gps_Par_t *)0x0);
  }
  pGVar3 = Gia_ManDup(pInit);
  if (pGVar3->nObjs != pGVar3->vCis->nSize + pGVar3->vCos->nSize + 1) {
    if ((pGVar3->pManTime != (void *)0x0) && (pGVar3->vLevels == (Vec_Int_t *)0x0)) {
      Gia_ManLevelWithBoxes(pGVar3);
    }
    pGVar4 = pGVar3;
    if (pInit->vMapping != (Vec_Int_t *)0x0) {
      Gia_ManTransferMapping(pGVar3,pInit);
      pGVar4 = (Gia_Man_t *)Dsm_ManDeriveGia(pGVar3,0);
      Gia_ManStop(pGVar3);
    }
    pGVar3 = Gia_ManAreaBalance(pGVar4,0,1000000000,0,0);
    if (iVar1 == 0) {
      pGVar5 = Lf_ManPerformMapping(pGVar3,&local_138);
    }
    else {
      Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
      pGVar5 = Lf_ManPerformMapping(pGVar3,&local_138);
      Gia_ManPrintStats(pGVar5,(Gps_Par_t *)0x0);
    }
    if (pGVar3 != pGVar5) {
      Gia_ManStop(pGVar3);
    }
    if ((*(int *)((long)pPars0 + 0x24) == 0) && (pGVar5->nBufs == 0)) {
      pGVar3 = Gia_ManAreaBalance(pGVar5,0,1000000000,0,0);
      if (iVar1 != 0) {
        Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
      }
      Gia_ManStop(pGVar5);
      p = Gia_ManPerformDsdBalance(pGVar3,6,8,0,0);
    }
    else {
      p = Gia_ManAreaBalance(pGVar5,0,1000000000,0,0);
      pGVar3 = pGVar5;
    }
    if (iVar1 != 0) {
      Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
    }
    pGVar5 = pGVar3;
    pGia3 = p;
    pGia1 = pGVar4;
    if (pInit->nBufs != 0) {
      if (pInit->nBufs != pGVar4->nBufs) {
        __assert_fail("Gia_ManBufNum(pInit) == Gia_ManBufNum(pGia1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                      ,0x1bf,"Gia_Man_t *Gia_ManAigSynch2(Gia_Man_t *, void *, int, int)");
      }
      pGia1 = Gia_ManDupFromBarBufs(pGVar4);
      Gia_ManStop(pGVar4);
      if (pInit->nBufs != pGVar3->nBufs) {
        __assert_fail("Gia_ManBufNum(pInit) == Gia_ManBufNum(pGia2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                      ,0x1c2,"Gia_Man_t *Gia_ManAigSynch2(Gia_Man_t *, void *, int, int)");
      }
      pGVar5 = Gia_ManDupFromBarBufs(pGVar3);
      Gia_ManStop(pGVar3);
      if (pInit->nBufs != p->nBufs) {
        __assert_fail("Gia_ManBufNum(pInit) == Gia_ManBufNum(pGia3)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                      ,0x1c5,"Gia_Man_t *Gia_ManAigSynch2(Gia_Man_t *, void *, int, int)");
      }
      pGia3 = Gia_ManDupFromBarBufs(p);
      Gia_ManStop(p);
    }
    pGVar4 = Gia_ManAigSynch2Choices(pGia1,pGVar5,pGia3,(Dch_Pars_t *)pPars0);
    Gia_ManStop(pGia1);
    Gia_ManStop(pGVar5);
    Gia_ManStop(pGia3);
    pGVar3 = pGVar4;
    if (pInit->nBufs != 0) {
      pGVar3 = Gia_ManDupToBarBufs(pGVar4,pInit->nBufs);
      Gia_ManStop(pGVar4);
    }
    if (pGVar3->pName != (char *)0x0) {
      free(pGVar3->pName);
      pGVar3->pName = (char *)0x0;
    }
    if (pGVar3->pSpec != (char *)0x0) {
      free(pGVar3->pSpec);
      pGVar3->pSpec = (char *)0x0;
    }
    pcVar2 = pInit->pName;
    if (pcVar2 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 1);
      strcpy(pcVar7,pcVar2);
    }
    pGVar3->pName = pcVar7;
    pcVar2 = pInit->pSpec;
    if (pcVar2 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 1);
      strcpy(pcVar7,pcVar2);
    }
    pGVar3->pSpec = pcVar7;
  }
  Gia_ManTransferTiming(pGVar3,pInit);
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_ManAigSynch2( Gia_Man_t * pInit, void * pPars0, int nLutSize, int nRelaxRatio )
{
    extern Gia_Man_t * Gia_ManLutBalance( Gia_Man_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose );
    Dch_Pars_t * pParsDch = (Dch_Pars_t *)pPars0;
    Gia_Man_t * pGia1, * pGia2, * pGia3, * pNew, * pTemp;
    int fVerbose = pParsDch->fVerbose;
    Jf_Par_t Pars, * pPars = &Pars;
    Lf_ManSetDefaultPars( pPars );
    pPars->fCutMin     = 1;
    pPars->fCoarsen    = 1;
    pPars->nRelaxRatio = nRelaxRatio;
    pPars->nAreaTuner  = 5;
    pPars->nCutNum     = 12;
    pPars->fVerbose    = fVerbose;
    if ( fVerbose )  Gia_ManPrintStats( pInit, NULL );
    pGia1 = Gia_ManDup( pInit );
    if ( Gia_ManAndNum(pGia1) == 0 )
    {
        Gia_ManTransferTiming( pGia1, pInit );
        return pGia1;
    }
    if ( pGia1->pManTime && pGia1->vLevels == NULL )
        Gia_ManLevelWithBoxes( pGia1 );
    // unmap if mapped
    if ( Gia_ManHasMapping(pInit) )
    {
        Gia_ManTransferMapping( pGia1, pInit );
        pGia1 = (Gia_Man_t *)Dsm_ManDeriveGia( pTemp = pGia1, 0 );
        Gia_ManStop( pTemp );
    }
    // perform balancing
    if ( Gia_ManBufNum(pGia1) || 1 )
        pGia2 = Gia_ManAreaBalance( pGia1, 0, ABC_INFINITY, 0, 0 );
    else
    {
        pGia2 = Gia_ManLutBalance( pGia1, nLutSize, 1, 1, 1, 0 );
        pGia2 = Gia_ManAreaBalance( pTemp = pGia2, 0, ABC_INFINITY, 0, 0 );
        Gia_ManStop( pTemp );
    }
    if ( fVerbose )     Gia_ManPrintStats( pGia2, NULL );
    // perform mapping
    pGia2 = Lf_ManPerformMapping( pTemp = pGia2, pPars );
    if ( fVerbose )     Gia_ManPrintStats( pGia2, NULL );
    if ( pTemp != pGia2 )
        Gia_ManStop( pTemp );
    // perform balancing
    if ( pParsDch->fLightSynth || Gia_ManBufNum(pGia2) )
        pGia3 = Gia_ManAreaBalance( pGia2, 0, ABC_INFINITY, 0, 0 );
    else
    {
        assert( Gia_ManBufNum(pGia2) == 0 );
        pGia2 = Gia_ManAreaBalance( pTemp = pGia2, 0, ABC_INFINITY, 0, 0 );
        if ( fVerbose )     Gia_ManPrintStats( pGia2, NULL );
        Gia_ManStop( pTemp );
        // perform DSD balancing
        pGia3 = Gia_ManPerformDsdBalance( pGia2, 6, 8, 0, 0 );
    }
    if ( fVerbose )     Gia_ManPrintStats( pGia3, NULL );
    // perform choice computation
    if ( Gia_ManBufNum(pInit) )
    {
        assert( Gia_ManBufNum(pInit) == Gia_ManBufNum(pGia1) );
        pGia1 = Gia_ManDupFromBarBufs( pTemp = pGia1 );
        Gia_ManStop( pTemp );
        assert( Gia_ManBufNum(pInit) == Gia_ManBufNum(pGia2) );
        pGia2 = Gia_ManDupFromBarBufs( pTemp = pGia2 );
        Gia_ManStop( pTemp );
        assert( Gia_ManBufNum(pInit) == Gia_ManBufNum(pGia3) );
        pGia3 = Gia_ManDupFromBarBufs( pTemp = pGia3 );
        Gia_ManStop( pTemp );
    }
    pNew = Gia_ManAigSynch2Choices( pGia1, pGia2, pGia3, pParsDch );
    Gia_ManStop( pGia1 );
    Gia_ManStop( pGia2 );
    Gia_ManStop( pGia3 );
    if ( Gia_ManBufNum(pInit) )
    {
        pNew = Gia_ManDupToBarBufs( pTemp = pNew, Gia_ManBufNum(pInit) );
        Gia_ManStop( pTemp );
    }
    // copy names
    ABC_FREE( pNew->pName );
    ABC_FREE( pNew->pSpec );
    pNew->pName = Abc_UtilStrsav(pInit->pName);
    pNew->pSpec = Abc_UtilStrsav(pInit->pSpec);
    Gia_ManTransferTiming( pNew, pInit );
    return pNew;
}